

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code
llvm::sys::fs::make_absolute
          (Twine *current_directory,SmallVectorImpl<char> *path,bool use_current_directory)

{
  StringRef path_00;
  bool bVar1;
  Style style;
  path *ppVar2;
  iterator S;
  iterator E;
  StringRef path_01;
  StringRef path_02;
  error_code eVar3;
  bool local_411;
  Twine local_410;
  Twine local_3f8;
  Twine local_3e0;
  Twine local_3c8;
  undefined1 local_3b0 [8];
  SmallString<128U> res;
  undefined1 local_310 [8];
  StringRef pRelativePath;
  char *local_2f8;
  undefined1 local_2f0 [8];
  StringRef bRelativePath;
  undefined1 local_2d0 [8];
  StringRef bRootDirectory;
  undefined1 local_2b0 [8];
  StringRef pRootName;
  Twine local_288;
  Twine local_270;
  Twine local_258;
  undefined1 local_240 [8];
  SmallString<128U> curDirRootName;
  undefined1 local_1a0 [8];
  StringRef cdrn;
  Twine local_178;
  Twine local_160;
  Twine local_148;
  undefined4 local_12c;
  undefined1 local_128 [8];
  SmallString<128U> current_dir;
  undefined1 local_78 [7];
  bool rootName;
  byte local_59;
  undefined1 auStack_58 [7];
  bool rootDirectory;
  StringRef p;
  bool use_current_directory_local;
  SmallVectorImpl<char> *path_local;
  Twine *current_directory_local;
  error_code ec;
  
  p.Length._7_1_ = use_current_directory;
  ppVar2 = (path *)SmallVectorTemplateCommon<char,_void>::data
                             ((SmallVectorTemplateCommon<char,_void> *)path);
  p.Data = (char *)SmallVectorBase::size((SmallVectorBase *)path);
  _auStack_58 = ppVar2;
  ec._M_cat = (error_category *)p.Data;
  Twine::Twine((Twine *)local_78,(StringRef *)auStack_58);
  local_59 = sys::path::has_root_directory((Twine *)local_78,native);
  style = anon_unknown.dwarf_208f76::real_style(native);
  local_411 = true;
  if (style == windows) {
    Twine::Twine((Twine *)(current_dir.super_SmallVector<char,_128U>.
                           super_SmallVectorStorage<char,_128U>.InlineElts + 0x78),
                 (StringRef *)auStack_58);
    local_411 = sys::path::has_root_name
                          ((Twine *)(current_dir.super_SmallVector<char,_128U>.
                                     super_SmallVectorStorage<char,_128U>.InlineElts + 0x78),native)
    ;
  }
  if ((local_411 != false) && ((local_59 & 1) != 0)) {
    std::error_code::error_code((error_code *)&current_directory_local);
    goto LAB_0021c905;
  }
  SmallString<128U>::SmallString((SmallString<128U> *)local_128);
  if ((p.Length._7_1_ & 1) == 0) {
    eVar3 = current_path((SmallVectorImpl<char> *)local_128);
    ec._0_8_ = eVar3._M_cat;
    current_directory_local._0_4_ = eVar3._M_value;
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&current_directory_local);
    if (!bVar1) goto LAB_0021c549;
    local_12c = 1;
  }
  else {
    Twine::toVector(current_directory,(SmallVectorImpl<char> *)local_128);
LAB_0021c549:
    if ((local_411 == false) && ((local_59 & 1) == 0)) {
      Twine::Twine(&local_148,(StringRef *)auStack_58);
      Twine::Twine(&local_160,"");
      Twine::Twine(&local_178,"");
      Twine::Twine((Twine *)&cdrn.Length,"");
      sys::path::append((SmallVectorImpl<char> *)local_128,&local_148,&local_160,&local_178,
                        (Twine *)&cdrn.Length);
      SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_128);
      std::error_code::error_code((error_code *)&current_directory_local);
      local_12c = 1;
    }
    else if ((local_411 == false) && ((local_59 & 1) != 0)) {
      join_0x00000010_0x00000000_ =
           SmallString::operator_cast_to_StringRef((SmallString *)local_128);
      _local_1a0 = sys::path::root_name(join_0x00000010_0x00000000_,native);
      S = StringRef::begin((StringRef *)local_1a0);
      E = StringRef::end((StringRef *)local_1a0);
      SmallString<128u>::SmallString<char_const*>((SmallString<128u> *)local_240,S,E);
      Twine::Twine(&local_258,(StringRef *)auStack_58);
      Twine::Twine(&local_270,"");
      Twine::Twine(&local_288,"");
      Twine::Twine((Twine *)&pRootName.Length,"");
      sys::path::append((SmallVectorImpl<char> *)local_240,&local_258,&local_270,&local_288,
                        (Twine *)&pRootName.Length);
      SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_240);
      std::error_code::error_code((error_code *)&current_directory_local);
      local_12c = 1;
      SmallString<128U>::~SmallString((SmallString<128U> *)local_240);
    }
    else {
      if ((local_411 == false) || ((local_59 & 1) != 0)) {
        llvm_unreachable_internal
                  ("All rootName and rootDirectory combinations should have occurred above!",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                   ,0x37e);
      }
      bRootDirectory.Length = (size_t)_auStack_58;
      path_00.Length = (size_t)p.Data;
      path_00.Data = (char *)_auStack_58;
      _local_2b0 = sys::path::root_name(path_00,native);
      join_0x00000010_0x00000000_ =
           SmallString::operator_cast_to_StringRef((SmallString *)local_128);
      _local_2d0 = sys::path::root_directory(join_0x00000010_0x00000000_,native);
      join_0x00000010_0x00000000_ =
           SmallString::operator_cast_to_StringRef((SmallString *)local_128);
      path_01.Length = 2;
      path_01.Data = local_2f8;
      _local_2f0 = sys::path::relative_path((path *)pRelativePath.Length,path_01,style);
      res.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ =
           _auStack_58;
      path_02.Length = 2;
      path_02.Data = p.Data;
      _local_310 = sys::path::relative_path(_auStack_58,path_02,style);
      SmallString<128U>::SmallString((SmallString<128U> *)local_3b0);
      Twine::Twine(&local_3c8,(StringRef *)local_2b0);
      Twine::Twine(&local_3e0,(StringRef *)local_2d0);
      Twine::Twine(&local_3f8,(StringRef *)local_2f0);
      Twine::Twine(&local_410,(StringRef *)local_310);
      sys::path::append((SmallVectorImpl<char> *)local_3b0,&local_3c8,&local_3e0,&local_3f8,
                        &local_410);
      SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_3b0);
      std::error_code::error_code((error_code *)&current_directory_local);
      local_12c = 1;
      SmallString<128U>::~SmallString((SmallString<128U> *)local_3b0);
    }
  }
  SmallString<128U>::~SmallString((SmallString<128U> *)local_128);
LAB_0021c905:
  eVar3._4_4_ = 0;
  eVar3._M_value = (uint)current_directory_local;
  eVar3._M_cat = (error_category *)ec._0_8_;
  return eVar3;
}

Assistant:

static std::error_code make_absolute(const Twine &current_directory,
                                     SmallVectorImpl<char> &path,
                                     bool use_current_directory) {
  StringRef p(path.data(), path.size());

  bool rootDirectory = path::has_root_directory(p);
  bool rootName =
      (real_style(Style::native) != Style::windows) || path::has_root_name(p);

  // Already absolute.
  if (rootName && rootDirectory)
    return std::error_code();

  // All of the following conditions will need the current directory.
  SmallString<128> current_dir;
  if (use_current_directory)
    current_directory.toVector(current_dir);
  else if (std::error_code ec = current_path(current_dir))
    return ec;

  // Relative path. Prepend the current directory.
  if (!rootName && !rootDirectory) {
    // Append path to the current directory.
    path::append(current_dir, p);
    // Set path to the result.
    path.swap(current_dir);
    return std::error_code();
  }

  if (!rootName && rootDirectory) {
    StringRef cdrn = path::root_name(current_dir);
    SmallString<128> curDirRootName(cdrn.begin(), cdrn.end());
    path::append(curDirRootName, p);
    // Set path to the result.
    path.swap(curDirRootName);
    return std::error_code();
  }

  if (rootName && !rootDirectory) {
    StringRef pRootName      = path::root_name(p);
    StringRef bRootDirectory = path::root_directory(current_dir);
    StringRef bRelativePath  = path::relative_path(current_dir);
    StringRef pRelativePath  = path::relative_path(p);

    SmallString<128> res;
    path::append(res, pRootName, bRootDirectory, bRelativePath, pRelativePath);
    path.swap(res);
    return std::error_code();
  }

  llvm_unreachable("All rootName and rootDirectory combinations should have "
                   "occurred above!");
}